

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O1

void __thiscall PDA::Transducer::Tokenizer::printIdentifiers(Tokenizer *this)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  pointer pIVar4;
  pointer pbVar5;
  wostream *pwVar6;
  wostream *this_00;
  Context cnt;
  Type extraout_EDX;
  Type extraout_EDX_00;
  Type extraout_EDX_01;
  Type TVar7;
  size_type sVar8;
  wchar_t *pwVar9;
  pointer pIVar10;
  int iVar11;
  undefined1 auVar12 [12];
  wstring local_70;
  wstring local_50;
  
  lVar2 = *(long *)(std::wcout + -0x18);
  std::wios::fill();
  *(undefined4 *)(std::__cxx11::string::_M_create + lVar2) = 0x3d;
  *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 0xbe;
  local_70._M_dataplus._M_p._0_4_ = 10;
  pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     ((wostream *)&std::wcout,(wchar_t *)&local_70,1);
  lVar2 = *(long *)(*(long *)pwVar6 + -0x18);
  std::wios::fill();
  *(undefined4 *)(pwVar6 + lVar2 + 0xe0) = 0x20;
  lVar2 = std::wcout;
  *(uint *)(std::locale::~locale + *(long *)(std::wcout + -0x18)) =
       *(uint *)(std::locale::~locale + *(long *)(std::wcout + -0x18)) & 0xffffff4f | 0x20;
  *(undefined8 *)(std::locale::global + *(long *)(lVar2 + -0x18)) = 5;
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)&std::wcout,L"ID",2);
  *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 10;
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)&std::wcout,L"TYPE",4);
  *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 0xf;
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)&std::wcout,L"CONTEXT",7);
  *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 10;
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)&std::wcout,L"RBPOFFSET",9);
  *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 10;
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)&std::wcout,L"NAME",4);
  *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 0x14;
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)&std::wcout,L"DECORATED",9);
  *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 0x1e;
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)&std::wcout,L"VALUE",5);
  *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 10;
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)&std::wcout,L"RETTYPE",7);
  *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 5;
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)&std::wcout,L"ROW",3);
  *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 5;
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)&std::wcout,L"COL",3);
  *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 0x50;
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)&std::wcout,L"FILENAME",8);
  plVar3 = *(long **)(std::__cxx11::wstring::operator= + *(long *)(std::wcout + -0x18));
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 0x50))(plVar3,10);
    std::wostream::put(L'\x00150238');
    std::wostream::flush();
    pIVar10 = (this->m_identifiers).
              super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pIVar4 = (this->m_identifiers).
             super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pIVar10 != pIVar4) {
      iVar11 = 0;
      do {
        *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 5;
        auVar12 = std::wostream::operator<<((wostream *)&std::wcout,iVar11);
        pwVar6 = auVar12._0_8_;
        *(undefined8 *)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0x10) = 10;
        Identifier::typeToString_abi_cxx11_
                  (&local_70,(Identifier *)(ulong)pIVar10->type,auVar12._8_4_);
        pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (pwVar6,(wchar_t *)
                                   CONCAT44(local_70._M_dataplus._M_p._4_4_,
                                            local_70._M_dataplus._M_p._0_4_),
                            local_70._M_string_length);
        *(undefined8 *)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0x10) = 0xf;
        Identifier::contextToString_abi_cxx11_(&local_50,(Identifier *)(ulong)pIVar10->context,cnt);
        pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (pwVar6,local_50._M_dataplus._M_p,local_50._M_string_length);
        *(undefined8 *)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0x10) = 10;
        pwVar6 = (wostream *)std::wostream::operator<<((wostream *)pwVar6,pIVar10->rbpOffset);
        *(undefined8 *)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0x10) = 10;
        pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (pwVar6,(pIVar10->name)._M_dataplus._M_p,(pIVar10->name)._M_string_length
                           );
        *(undefined8 *)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0x10) = 0x14;
        pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (pwVar6,(pIVar10->decoratedName)._M_dataplus._M_p,
                            (pIVar10->decoratedName)._M_string_length);
        *(undefined8 *)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0x10) = 0x1e;
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity * 4 + 4);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_) !=
            &local_70.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_),
                          local_70.field_2._M_allocated_capacity * 4 + 4);
        }
        if (pIVar10->context == Literal) {
          TVar7 = pIVar10->type;
          if (TVar7 - Integer < 2) {
            std::wostream::_M_insert<long_long>((longlong)&std::wcout);
            TVar7 = extraout_EDX_00;
          }
          else {
            if (TVar7 != Double) {
              if (TVar7 != String) goto LAB_0010899e;
              pwVar9 = (pIVar10->value).stringValue._M_dataplus._M_p;
              sVar8 = (pIVar10->value).stringValue._M_string_length;
              goto LAB_001089aa;
            }
            std::wostream::_M_insert<double>((pIVar10->value).field_0.doubleValue);
            TVar7 = extraout_EDX_01;
          }
        }
        else {
LAB_0010899e:
          pwVar9 = L"";
          sVar8 = 0;
LAB_001089aa:
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                    ((wostream *)&std::wcout,pwVar9,sVar8);
          TVar7 = extraout_EDX;
        }
        *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 10;
        Identifier::typeToString_abi_cxx11_
                  (&local_70,(Identifier *)(ulong)pIVar10->returnType,TVar7);
        pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           ((wostream *)&std::wcout,
                            (wchar_t *)
                            CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_
                                    ),local_70._M_string_length);
        *(undefined8 *)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0x10) = 5;
        this_00 = (wostream *)
                  std::wostream::operator<<
                            ((wostream *)pwVar6,
                             (this->m_tokens).
                             super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                             ._M_impl.super__Vector_impl_data._M_start[pIVar10->tokenIndex].line);
        *(undefined8 *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x10) = 5;
        pwVar6 = (wostream *)
                 std::wostream::operator<<
                           (this_00,(this->m_tokens).
                                    super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                                    ._M_impl.super__Vector_impl_data._M_start[pIVar10->tokenIndex].
                                    position - (int)(pIVar10->name)._M_string_length);
        *(undefined8 *)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0x10) = 0x50;
        pbVar5 = (this->m_files).
                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar1 = (this->m_tokens).
                super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
                _M_impl.super__Vector_impl_data._M_start[pIVar10->tokenIndex].fileIndex;
        pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (pwVar6,pbVar5[iVar1]._M_dataplus._M_p,pbVar5[iVar1]._M_string_length);
        plVar3 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
        if (plVar3 == (long *)0x0) {
          std::__throw_bad_cast();
        }
        (**(code **)(*plVar3 + 0x50))(plVar3,10);
        std::wostream::put((wchar_t)pwVar6);
        std::wostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_) !=
            &local_70.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_),
                          local_70.field_2._M_allocated_capacity * 4 + 4);
        }
        pIVar10 = pIVar10 + 1;
        iVar11 = iVar11 + 1;
      } while (pIVar10 != pIVar4);
    }
    lVar2 = *(long *)(std::wcout + -0x18);
    std::wios::fill();
    *(undefined4 *)(std::__cxx11::string::_M_create + lVar2) = 0x3d;
    *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 0xbe;
    local_70._M_dataplus._M_p._0_4_ = 0x20;
    pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       ((wostream *)&std::wcout,(wchar_t *)&local_70,1);
    lVar2 = *(long *)(*(long *)pwVar6 + -0x18);
    std::wios::fill();
    *(undefined4 *)(pwVar6 + lVar2 + 0xe0) = 0x20;
    plVar3 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x50))(plVar3,10);
      std::wostream::put((wchar_t)pwVar6);
      std::wostream::flush();
      return;
    }
  }
  std::__throw_bad_cast();
}

Assistant:

void Tokenizer::printIdentifiers() const
{
    std::wcout << std::setfill(L'=') << std::setw(190) << L'\n' << std::setfill(L' ');
    std::wcout << std::left << std::setw(5) << L"ID" << std::setw(10) << L"TYPE" << std::setw(15) << L"CONTEXT" << std::setw(10) << L"RBPOFFSET" << std::setw(10) << L"NAME" << std::setw(20) << L"DECORATED"
               << std::setw(30) << L"VALUE" << std::setw(10) << L"RETTYPE" << std::setw(5) << L"ROW" << std::setw(5) << L"COL"
               << std::setw(80) << L"FILENAME" << std::endl;
    int id{0};
    for(const Identifier &identifier : m_identifiers)
    {
        std::wcout << std::setw(5) << id++ << std::setw(10) << Identifier::typeToString(identifier.type) << std::setw(15) << Identifier::contextToString(identifier.context)
                   << std::setw(10) << identifier.rbpOffset << std::setw(10) << identifier.name
                   << std::setw(20) << identifier.decoratedName << std::setw(30);
        if (identifier.context == Identifier::Context::Literal)
        {
            if (identifier.type == Identifier::Type::String)
                std::wcout << identifier.value.stringValue;
            else if (identifier.type == Identifier::Type::Integer || identifier.type == Identifier::Type::Bool)
                std::wcout << identifier.value.intValue;
            else if (identifier.type == Identifier::Type::Double)
                std::wcout << identifier.value.doubleValue;
            else
                std::wcout << L"";
        }
        else
            std::wcout << L"";

        std::wcout << std::setw(10) << Identifier::typeToString(identifier.returnType) << std::setw(5)
                   << m_tokens[static_cast<size_t>(identifier.tokenIndex)].line << std::setw(5)
                   << m_tokens[static_cast<size_t>(identifier.tokenIndex)].position - static_cast<int>(identifier.name.size())
                   << std::setw(80) <<  m_files[static_cast<size_t>(m_tokens[static_cast<size_t>(identifier.tokenIndex)].fileIndex)] << std::endl;
    }
    std::wcout << std::setfill(L'=') << std::setw(190) << L' ' << std::setfill(L' ') << std::endl;
}